

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O1

bool __thiscall gimage::RAWImageIO::handlesFile(RAWImageIO *this,char *name,bool reading)

{
  long lVar1;
  bool bVar2;
  string s;
  undefined1 *local_48;
  ulong local_40;
  undefined1 local_38 [16];
  undefined1 *local_28 [2];
  undefined1 local_18 [16];
  
  std::__cxx11::string::string((string *)&local_48,name,(allocator *)local_28);
  lVar1 = std::__cxx11::string::find((char)&local_48,0x26);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_28,(ulong)&local_48);
    std::__cxx11::string::operator=((string *)&local_48,(string *)local_28);
    if (local_28[0] != local_18) {
      operator_delete(local_28[0]);
    }
  }
  if (local_40 < 5) {
    bVar2 = false;
  }
  else {
    lVar1 = std::__cxx11::string::find((char *)&local_48,0x16448e,0);
    bVar2 = true;
    if (lVar1 != local_40 - 4) {
      lVar1 = std::__cxx11::string::find((char *)&local_48,0x164493,0);
      bVar2 = lVar1 == local_40 - 4;
    }
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return bVar2;
}

Assistant:

bool RAWImageIO::handlesFile(const char *name, bool reading) const
{
  std::string s=name;
  size_t pos;

  pos=s.find('&');

  if (pos != s.npos)
  {
    s=s.substr(0, pos);
  }

  if (s.size() <= 4)
  {
    return false;
  }

  if (s.find(".raw") == s.size()-4 || s.find(".RAW") == s.size()-4)
  {
    return true;
  }

  return false;
}